

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O2

void vk::imageUtilSelfTest(void)

{
  bool bVar1;
  VkFormat VVar2;
  VkFormat VVar3;
  TextureFormat in_RAX;
  TextureFormat TVar4;
  int formatNdx;
  VkFormat format;
  TextureFormat tcuFormat;
  TextureFormat local_38;
  
  format = VK_FORMAT_UNDEFINED;
  local_38 = in_RAX;
  do {
    if (format == (VK_FORMAT_ASTC_12x12_SRGB_BLOCK|VK_FORMAT_R4G4_UNORM_PACK8)) {
      return;
    }
    if ((((format != VK_FORMAT_UNDEFINED) && (1 < format - VK_FORMAT_R64G64B64A64_UINT)) &&
        ((format & (VK_FORMAT_D16_UNORM_S8_UINT|VK_FORMAT_D32_SFLOAT)) != VK_FORMAT_R64G64B64_UINT))
       && (((format & (VK_FORMAT_D16_UNORM_S8_UINT|VK_FORMAT_D32_SFLOAT)) != VK_FORMAT_R64_UINT &&
           (1 < format - VK_FORMAT_R64G64_UINT)))) {
      bVar1 = isCompressedFormat(format);
      if (!bVar1) {
        TVar4 = mapVkFormat(format);
        local_38 = TVar4;
        VVar2 = mapTextureFormat(&local_38);
        bVar1 = tcu::isValid(TVar4);
        if (!bVar1) {
          deAssertFail("isValid(tcuFormat)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
                       ,0x2d3);
        }
        VVar3 = format & (VK_FORMAT_D16_UNORM_S8_UINT|VK_FORMAT_S8_UINT);
        if ((byte)format < 0x3e) {
          if ((0x3000c183060c1800U >> ((ulong)VVar3 & 0x3f) & 1) == 0) {
            if ((0x3f8000000000001U >> ((ulong)VVar3 & 0x3f) & 1) != 0) goto LAB_008c69f4;
            goto LAB_008c69cc;
          }
LAB_008c69de:
          TVar4 = mapVkFormat(format);
          if ((TVar4.type < HALF_FLOAT) &&
             ((0x2f8300000U >> ((ulong)TVar4 >> 0x20 & 0x3f) & 1) != 0)) goto LAB_008c69f4;
        }
        else {
LAB_008c69cc:
          if ((VVar3 - VK_FORMAT_A2B10G10R10_USCALED_PACK32 < 0x1d) &&
             ((0x183060c3U >> (VVar3 - VK_FORMAT_A2B10G10R10_USCALED_PACK32 & 0x1f) & 1) != 0))
          goto LAB_008c69de;
        }
        if (format != VVar2) {
          deAssertFail("format == remappedFormat",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
                       ,0x2d6);
        }
      }
    }
LAB_008c69f4:
    format = format + VK_FORMAT_R4G4_UNORM_PACK8;
  } while( true );
}

Assistant:

void imageUtilSelfTest (void)
{
	for (int formatNdx = 0; formatNdx < VK_CORE_FORMAT_LAST; formatNdx++)
	{
		const VkFormat	format	= (VkFormat)formatNdx;

		if (format == VK_FORMAT_R64_UINT			||
			format == VK_FORMAT_R64_SINT			||
			format == VK_FORMAT_R64G64_UINT			||
			format == VK_FORMAT_R64G64_SINT			||
			format == VK_FORMAT_R64G64B64_UINT		||
			format == VK_FORMAT_R64G64B64_SINT		||
			format == VK_FORMAT_R64G64B64A64_UINT	||
			format == VK_FORMAT_R64G64B64A64_SINT)
			continue; // \todo [2015-12-05 pyry] Add framework support for (u)int64 channel type

		if (format != VK_FORMAT_UNDEFINED && !isCompressedFormat(format))
		{
			const tcu::TextureFormat	tcuFormat		= mapVkFormat(format);
			const VkFormat				remappedFormat	= mapTextureFormat(tcuFormat);

			DE_TEST_ASSERT(isValid(tcuFormat));

			if (fullTextureFormatRoundTripSupported(format))
				DE_TEST_ASSERT(format == remappedFormat);
		}
	}
}